

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O2

idx_t __thiscall duckdb::JoinHashTable::GetRemainingSize(JoinHashTable *this)

{
  pointer this_00;
  unsafe_vector<unique_ptr<TupleDataCollection>_> *puVar1;
  pointer pTVar2;
  idx_t *piVar3;
  idx_t iVar4;
  idx_t iVar5;
  long lVar6;
  long lVar7;
  idx_t partition_idx;
  ulong uVar8;
  idx_t local_40;
  
  iVar5 = this->radix_bits;
  this_00 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
            ::operator->(&this->sink_collection);
  puVar1 = PartitionedTupleData::GetPartitions(this_00);
  lVar6 = 0;
  local_40 = 0;
  lVar7 = 0;
  for (uVar8 = 0; uVar8 >> ((byte)iVar5 & 0x3f) == 0; uVar8 = uVar8 + 1) {
    if (((this->completed_partitions).super_TemplatedValidityMask<unsigned_long>.validity_mask
         [uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0) {
      pTVar2 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
               ::operator->((unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
                             *)((long)&(((puVar1->
                                         super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                                         ).
                                         super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super_unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>
                                       )._M_t + lVar6));
      piVar3 = TupleDataCollection::Count(pTVar2);
      local_40 = local_40 + *piVar3;
      pTVar2 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
               ::operator->((unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
                             *)((long)&(((puVar1->
                                         super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                                         ).
                                         super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super_unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>
                                       )._M_t + lVar6));
      iVar4 = TupleDataCollection::SizeInBytes(pTVar2);
      lVar7 = lVar7 + iVar4;
    }
    lVar6 = lVar6 + 8;
  }
  iVar5 = PointerTableSize(this,local_40);
  return iVar5 + lVar7;
}

Assistant:

idx_t JoinHashTable::GetRemainingSize() const {
	const auto num_partitions = RadixPartitioning::NumberOfPartitions(radix_bits);
	auto &partitions = sink_collection->GetPartitions();

	idx_t count = 0;
	idx_t data_size = 0;
	for (idx_t partition_idx = 0; partition_idx < num_partitions; partition_idx++) {
		if (completed_partitions.RowIsValidUnsafe(partition_idx)) {
			continue;
		}
		count += partitions[partition_idx]->Count();
		data_size += partitions[partition_idx]->SizeInBytes();
	}

	return data_size + PointerTableSize(count);
}